

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O2

void __thiscall
SBarInfoCommandFlowControl::SetTruth
          (SBarInfoCommandFlowControl *this,bool truth,SBarInfoMainBlock *block,DSBarInfo *statusBar
          )

{
  _func_int *UNRECOVERED_JUMPTABLE;
  
  if ((this->truth != truth) && (this->truth = truth, block != (SBarInfoMainBlock *)0x0)) {
    UNRECOVERED_JUMPTABLE = (this->super_SBarInfoCommand)._vptr_SBarInfoCommand[5];
    (*UNRECOVERED_JUMPTABLE)(this,block,statusBar,1,UNRECOVERED_JUMPTABLE);
    return;
  }
  return;
}

Assistant:

void	SetTruth(bool truth, const SBarInfoMainBlock *block, const DSBarInfo *statusBar)
		{
			// If there is no change we don't need to do anything.  Do note
			// that this should not change more than once per tick.  If it does
			// there may be cosmetic problems.
			if(this->truth == truth)
				return;

			this->truth = truth;
			if(block != NULL)
				Tick(block, statusBar, true);
		}